

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError getnum(long *val,char *str,int base)

{
  int iVar1;
  bool bVar2;
  curl_off_t cStack_30;
  _Bool is_neg;
  curl_off_t num;
  char *pcStack_20;
  int base_local;
  char *str_local;
  long *val_local;
  
  if (str != (char *)0x0) {
    bVar2 = false;
    num._4_4_ = base;
    pcStack_20 = str;
    str_local = (char *)val;
    if (base == 10) {
      bVar2 = *str == '-';
      if (bVar2) {
        pcStack_20 = str + 1;
      }
      iVar1 = Curl_str_number(&stack0xffffffffffffffe0,&stack0xffffffffffffffd0,0x7fffffffffffffff);
      if (iVar1 != 0) {
        return PARAM_BAD_NUMERIC;
      }
    }
    else {
      iVar1 = Curl_str_octal(&stack0xffffffffffffffe0,&stack0xffffffffffffffd0,0x7fffffffffffffff);
      if (iVar1 != 0) {
        return PARAM_BAD_NUMERIC;
      }
    }
    iVar1 = Curl_str_single(&stack0xffffffffffffffe0,'\0');
    if (iVar1 == 0) {
      *(curl_off_t *)str_local = cStack_30;
      if (bVar2) {
        *(long *)str_local = -*(long *)str_local;
      }
      return PARAM_OK;
    }
  }
  return PARAM_BAD_NUMERIC;
}

Assistant:

static ParameterError getnum(long *val, const char *str, int base)
{
  DEBUGASSERT((base == 8) || (base == 10));
  if(str) {
    curl_off_t num;
    bool is_neg = FALSE;
    if(base == 10) {
      is_neg = (*str == '-');
      if(is_neg)
        str++;
      if(curlx_str_number(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    else { /* base == 8 */
      if(curlx_str_octal(&str, &num, LONG_MAX))
        return PARAM_BAD_NUMERIC;
    }
    if(!curlx_str_single(&str, '\0')) {
      *val = (long)num;
      if(is_neg)
        *val = -*val;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}